

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::_q_nextMonthClicked(QCalendarWidgetPrivate *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  QDate currentDate;
  QDate in_stack_00000088;
  qint64 local_18;
  QCalendarWidgetPrivate *this_00;
  
  this_00 = *(QCalendarWidgetPrivate **)(in_FS_OFFSET + 0x28);
  local_18 = (qint64)getCurrentDate((QCalendarWidgetPrivate *)&DAT_aaaaaaaaaaaaaaaa);
  QDate::addMonths(&local_18,1,*(undefined8 *)(*(long *)(in_RDI + 600) + 0x18));
  updateCurrentPage(this_00,in_stack_00000088);
  if (*(QCalendarWidgetPrivate **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_nextMonthClicked()
{
    QDate currentDate = getCurrentDate().addMonths(1, m_model->m_calendar);
    updateCurrentPage(currentDate);
}